

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O3

void __thiscall Token_stream::ignore(Token_stream *this,char c)

{
  bool bVar1;
  char cVar2;
  
  bVar1 = this->full;
  cVar2 = (this->buffer).kind;
  this->full = false;
  if (bVar1 != true) goto LAB_00104806;
  do {
    if (cVar2 == c) {
      return;
    }
LAB_00104806:
    cVar2 = std::istream::get();
  } while (cVar2 != '\n');
  return;
}

Assistant:

void Token_stream::ignore(char c)
{
	if (full && c == buffer.kind)
	{
		full = false;
		return;
	}
	full = false;

	char ch;
	while (true)
	{
		ch = is.get();
		if (ch == c || ch == '\n')
			return;
	}
}